

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void HuffmanTree_cleanup(HuffmanTree *tree)

{
  lodepng_free((void *)0x110bd1);
  lodepng_free((void *)0x110bde);
  lodepng_free((void *)0x110beb);
  return;
}

Assistant:

static void HuffmanTree_cleanup(HuffmanTree* tree)
{
  lodepng_free(tree->tree2d);
  lodepng_free(tree->tree1d);
  lodepng_free(tree->lengths);
}